

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

bool __thiscall QDockAreaLayoutInfo::updateTabBar(QDockAreaLayoutInfo *this)

{
  QDockAreaLayoutItem *this_00;
  QDockAreaLayoutItem *pQVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  QMainWindowLayout *this_01;
  QTabBar *pQVar7;
  quintptr id;
  long lVar8;
  undefined4 extraout_var;
  QMetaType QVar10;
  quintptr qVar11;
  QDockWidgetGroupWindow *this_02;
  uint uVar12;
  ulong uVar13;
  anon_union_24_3_e3d07ef4_for_data *paVar14;
  bool bVar15;
  int iVar16;
  undefined8 uVar17;
  long lVar18;
  long in_FS_OFFSET;
  QStringView QVar19;
  QStringView QVar20;
  QString local_88;
  QMetaType local_68;
  QMetaType local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  byte local_40;
  undefined7 uStack_3f;
  long local_38;
  QMetaTypeInterface *pQVar9;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->tabbed != true) {
    bVar3 = false;
    goto LAB_003f33d2;
  }
  pQVar7 = this->tabBar;
  if (pQVar7 == (QTabBar *)0x0) {
    this_01 = qt_mainwindow_layout(this->mainWindow);
    pQVar7 = QMainWindowLayout::getTabBar((QMainWindowLayout *)this_01);
    this->tabBar = pQVar7;
    QTabBar::setShape(pQVar7,this->tabBarShape);
    QTabBar::setDrawBase(this->tabBar,true);
    pQVar7 = this->tabBar;
    if (pQVar7 != (QTabBar *)0x0) goto LAB_003f2f41;
    bVar2 = true;
    bVar15 = false;
  }
  else {
LAB_003f2f41:
    bVar15 = SUB81(pQVar7,0);
    QObject::blockSignals(bVar15);
    bVar2 = false;
  }
  id = currentTabId(this);
  if ((this->item_list).d.size == 0) {
    iVar16 = 0;
    uVar12 = 0;
  }
  else {
    lVar18 = 0;
    uVar13 = 0;
    bVar4 = 0;
    iVar16 = 0;
    do {
      pQVar1 = (this->item_list).d.ptr;
      this_00 = (QDockAreaLayoutItem *)((long)&pQVar1->widgetItem + lVar18);
      bVar3 = QDockAreaLayoutItem::skip(this_00);
      if (!bVar3) {
        if ((*(byte *)((long)&pQVar1->flags + lVar18) & 1) == 0) {
          paVar14 = &local_58;
          if (this_00->widgetItem != (QLayoutItem *)0x0) {
            (*this_00->widgetItem->_vptr_QLayoutItem[0xd])();
            lVar8 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
            lVar8 = *(long *)(lVar8 + 8);
            local_88.d.d = *(Data **)(lVar8 + 0x290);
            local_88.d.ptr = *(char16_t **)(lVar8 + 0x298);
            local_88.d.size = *(long *)(lVar8 + 0x2a0);
            if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
            if (this_00->widgetItem == (QLayoutItem *)0x0) {
              pQVar9 = (QMetaTypeInterface *)0x0;
            }
            else {
              iVar6 = (*this_00->widgetItem->_vptr_QLayoutItem[0xd])();
              pQVar9 = (QMetaTypeInterface *)CONCAT44(extraout_var,iVar6);
            }
            iVar6 = QTabBar::count(this->tabBar);
            if (iVar16 == iVar6) {
              QTabBar::insertTab(this->tabBar,iVar16,&local_88);
              QTabBar::setTabToolTip(this->tabBar,iVar16,&local_88);
              pQVar7 = this->tabBar;
              ::QVariant::QVariant((QVariant *)&local_58,(ulonglong)pQVar9);
LAB_003f325e:
              QTabBar::setTabData(pQVar7,iVar16,(QVariant *)&local_58);
              ::QVariant::~QVariant((QVariant *)&local_58);
            }
            else {
              QTabBar::tabData((QVariant *)paVar14,this->tabBar,iVar16);
              local_60.d_ptr =
                   (QMetaTypeInterface *)
                   &QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long_long>::metaType;
              local_68.d_ptr =
                   (QMetaTypeInterface *)(CONCAT71(uStack_3f,local_40) & 0xfffffffffffffffc);
              bVar3 = comparesEqual(&local_68,&local_60);
              if (bVar3) {
                uVar17 = local_58.shared;
                if ((local_40 & 1) != 0) {
                  uVar17 = *(QMetaTypeInterface **)
                            (local_58.shared +
                            (int)*(QFlagsStorageHelper<QArrayData::ArrayOption,_4> *)
                                  (local_58.shared + 4));
                }
              }
              else {
                local_68.d_ptr = (QMetaTypeInterface *)0x0;
                QVar10.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
                if ((local_40 & 1) != 0) {
                  paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                            (local_58.shared +
                            (int)*(QFlagsStorageHelper<QArrayData::ArrayOption,_4> *)
                                  (local_58.shared + 4));
                }
                QMetaType::convert(QVar10,paVar14,local_60,&local_68);
                uVar17 = local_68.d_ptr;
              }
              ::QVariant::~QVariant((QVariant *)&local_58);
              if ((QMetaTypeInterface *)uVar17 != pQVar9) {
                iVar6 = QTabBar::count(this->tabBar);
                if (iVar16 + 1 < iVar6) {
                  paVar14 = &local_58;
                  QTabBar::tabData((QVariant *)paVar14,this->tabBar,iVar16 + 1);
                  local_60.d_ptr =
                       (QMetaTypeInterface *)
                       &QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long_long>::metaType;
                  local_68.d_ptr =
                       (QMetaTypeInterface *)(CONCAT71(uStack_3f,local_40) & 0xfffffffffffffffc);
                  bVar3 = comparesEqual(&local_68,&local_60);
                  if (bVar3) {
                    uVar17 = local_58.shared;
                    if ((local_40 & 1) != 0) {
                      uVar17 = *(QMetaTypeInterface **)
                                (local_58.shared +
                                (int)*(QFlagsStorageHelper<QArrayData::ArrayOption,_4> *)
                                      (local_58.shared + 4));
                    }
                  }
                  else {
                    local_68.d_ptr = (QMetaTypeInterface *)0x0;
                    QVar10.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
                    if ((local_40 & 1) != 0) {
                      paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                                (local_58.shared +
                                (int)*(QFlagsStorageHelper<QArrayData::ArrayOption,_4> *)
                                      (local_58.shared + 4));
                    }
                    QMetaType::convert(QVar10,paVar14,local_60,&local_68);
                    uVar17 = local_68.d_ptr;
                  }
                  ::QVariant::~QVariant((QVariant *)&local_58);
                  if ((QMetaTypeInterface *)uVar17 == pQVar9) {
                    QTabBar::removeTab(this->tabBar,iVar16);
                    goto LAB_003f3271;
                  }
                }
                QTabBar::insertTab(this->tabBar,iVar16,&local_88);
                QTabBar::setTabToolTip(this->tabBar,iVar16,&local_88);
                pQVar7 = this->tabBar;
                ::QVariant::QVariant((QVariant *)&local_58,(ulonglong)pQVar9);
                goto LAB_003f325e;
              }
            }
LAB_003f3271:
            QTabBar::tabText((QString *)&local_58,this->tabBar,iVar16);
            bVar5 = 1;
            if (local_88.d.size == local_58._16_8_) {
              QVar19.m_data = local_88.d.ptr;
              QVar19.m_size = local_88.d.size;
              QVar20.m_data = (storage_type_conflict *)local_58._8_8_;
              QVar20.m_size = local_88.d.size;
              bVar5 = QtPrivate::equalStrings(QVar19,QVar20);
              bVar5 = bVar5 ^ 1;
            }
            if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_58.shared = *(int *)local_58.shared + -1;
              UNLOCK();
              if (*(int *)local_58.shared == 0) {
                QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
              }
            }
            if (bVar5 != 0) {
              QTabBar::setTabText(this->tabBar,iVar16,&local_88);
              QTabBar::setTabToolTip(this->tabBar,iVar16,&local_88);
            }
            if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
              }
            }
            iVar16 = iVar16 + 1;
          }
        }
        else {
          bVar4 = 1;
        }
      }
      uVar13 = uVar13 + 1;
      lVar18 = lVar18 + 0x28;
    } while (uVar13 < (ulong)(this->item_list).d.size);
    uVar12 = (uint)bVar4;
  }
  while (iVar6 = QTabBar::count(this->tabBar), iVar16 < iVar6) {
    QTabBar::removeTab(this->tabBar,iVar16);
  }
  if ((id != 0) && (qVar11 = currentTabId(this), qVar11 != id)) {
    setCurrentTabId(this,id);
  }
  this_02 = (QDockWidgetGroupWindow *)
            QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
  if (this_02 != (QDockWidgetGroupWindow *)0x0) {
    QDockWidgetGroupWindow::adjustFlags(this_02);
  }
  iVar16 = QTabBar::count(this->tabBar);
  bVar3 = 1 < (int)(iVar16 + uVar12);
  if (!bVar2) {
    QObject::blockSignals(bVar15);
  }
LAB_003f33d2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QDockAreaLayoutInfo::updateTabBar() const
{
    if (!tabbed)
        return false;

    QDockAreaLayoutInfo *that = const_cast<QDockAreaLayoutInfo*>(this);

    if (that->tabBar == nullptr) {
        that->tabBar = mainWindowLayout()->getTabBar();
        that->tabBar->setShape(static_cast<QTabBar::Shape>(tabBarShape));
        that->tabBar->setDrawBase(true);
    }

    const QSignalBlocker blocker(tabBar);
    bool gap = false;

    const quintptr oldCurrentId = currentTabId();

    int tab_idx = 0;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;
        if (item.flags & QDockAreaLayoutItem::GapItem) {
            gap = true;
            continue;
        }
        if (item.widgetItem == nullptr)
            continue;

        QDockWidget *dw = qobject_cast<QDockWidget*>(item.widgetItem->widget());
        QString title = dw->d_func()->fixedWindowTitle;
        quintptr id = tabId(item);
        if (tab_idx == tabBar->count()) {
            tabBar->insertTab(tab_idx, title);
#if QT_CONFIG(tooltip)
            tabBar->setTabToolTip(tab_idx, title);
#endif
            tabBar->setTabData(tab_idx, id);
        } else if (qvariant_cast<quintptr>(tabBar->tabData(tab_idx)) != id) {
            if (tab_idx + 1 < tabBar->count()
                    && qvariant_cast<quintptr>(tabBar->tabData(tab_idx + 1)) == id)
                tabBar->removeTab(tab_idx);
            else {
                tabBar->insertTab(tab_idx, title);
#if QT_CONFIG(tooltip)
                tabBar->setTabToolTip(tab_idx, title);
#endif
                tabBar->setTabData(tab_idx, id);
            }
        }

        if (title != tabBar->tabText(tab_idx)) {
            tabBar->setTabText(tab_idx, title);
#if QT_CONFIG(tooltip)
            tabBar->setTabToolTip(tab_idx, title);
#endif
        }

        ++tab_idx;
    }

    while (tab_idx < tabBar->count()) {
        tabBar->removeTab(tab_idx);
    }

    if (oldCurrentId > 0 && currentTabId() != oldCurrentId)
        that->setCurrentTabId(oldCurrentId);

    if (QDockWidgetGroupWindow *dwgw = qobject_cast<QDockWidgetGroupWindow *>(tabBar->parent()))
        dwgw->adjustFlags();

    //returns if the tabbar is visible or not
    return ( (gap ? 1 : 0) + tabBar->count()) > 1;
}